

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O0

VmValue * CompileVmIntegerLiteral(ExpressionContext *ctx,VmModule *module,ExprIntegerLiteral *node)

{
  bool bVar1;
  VmConstant *pVVar2;
  ExprIntegerLiteral *node_local;
  VmModule *module_local;
  ExpressionContext *ctx_local;
  
  if ((node->super_ExprBase).type == ctx->typeShort) {
    pVVar2 = CreateConstantInt(module->allocator,(node->super_ExprBase).source,
                               (int)(short)node->value);
    ctx_local = (ExpressionContext *)
                anon_unknown.dwarf_aa461::CheckType
                          (ctx,&node->super_ExprBase,&pVVar2->super_VmValue);
  }
  else if ((node->super_ExprBase).type == ctx->typeInt) {
    pVVar2 = CreateConstantInt(module->allocator,(node->super_ExprBase).source,(int)node->value);
    ctx_local = (ExpressionContext *)
                anon_unknown.dwarf_aa461::CheckType
                          (ctx,&node->super_ExprBase,&pVVar2->super_VmValue);
  }
  else if ((node->super_ExprBase).type == ctx->typeLong) {
    pVVar2 = CreateConstantLong(module->allocator,(node->super_ExprBase).source,node->value);
    ctx_local = (ExpressionContext *)
                anon_unknown.dwarf_aa461::CheckType
                          (ctx,&node->super_ExprBase,&pVVar2->super_VmValue);
  }
  else {
    bVar1 = isType<TypeEnum>((node->super_ExprBase).type);
    if (!bVar1) {
      __assert_fail("!\"unknown type\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                    ,0xa00,
                    "VmValue *CompileVmIntegerLiteral(ExpressionContext &, VmModule *, ExprIntegerLiteral *)"
                   );
    }
    pVVar2 = CreateConstantInt(module->allocator,(node->super_ExprBase).source,(int)node->value);
    ctx_local = (ExpressionContext *)
                anon_unknown.dwarf_aa461::CheckType
                          (ctx,&node->super_ExprBase,&pVVar2->super_VmValue);
  }
  return (VmValue *)ctx_local;
}

Assistant:

VmValue* CompileVmIntegerLiteral(ExpressionContext &ctx, VmModule *module, ExprIntegerLiteral *node)
{
	if(node->type == ctx.typeShort)
		return CheckType(ctx, node, CreateConstantInt(module->allocator, node->source, short(node->value)));

	if(node->type == ctx.typeInt)
		return CheckType(ctx, node, CreateConstantInt(module->allocator, node->source, int(node->value)));

	if(node->type == ctx.typeLong)
		return CheckType(ctx, node, CreateConstantLong(module->allocator, node->source, node->value));

	if(isType<TypeEnum>(node->type))
		return CheckType(ctx, node, CreateConstantInt(module->allocator, node->source, int(node->value)));

	assert(!"unknown type");
	return NULL;
}